

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  iterator *piVar1;
  ValueHolder *pVVar2;
  TokenType TVar3;
  bool bVar4;
  _Elt_pointer ppVVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Value numberName;
  String name;
  Token colon;
  Token tokenName;
  Token comma;
  Value init;
  ValueHolder local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  String local_c8;
  String local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar5 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar5[-1],&local_58);
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar5 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar5[-1],(long)token->start_ - (long)this->begin_);
  do {
    bVar4 = readTokenSkippingComments(this,&local_88);
    TVar3 = local_88.type_;
    if (!bVar4) {
LAB_0012b092:
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \'}\' or object member name","");
      addError(this,(String *)&local_f0,&local_88,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0012b20a;
    }
    if (local_88.type_ == tokenObjectEnd) {
      bVar4 = true;
      if ((local_c8._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false)) {
        local_c8._M_string_length = 0;
        *local_c8._M_dataplus._M_p = '\0';
        goto LAB_0012b092;
      }
      goto LAB_0012b223;
    }
    local_c8._M_string_length = 0;
    *local_c8._M_dataplus._M_p = '\0';
    if (TVar3 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_0012b092;
      Value::Value((Value *)&local_f0,nullValue);
      bVar4 = decodeNumber(this,&local_88,(Value *)&local_f0);
      if (!bVar4) {
        recoverFromError(this,tokenObjectEnd);
        Value::~Value((Value *)&local_f0);
        goto LAB_0012b221;
      }
      Value::asString_abi_cxx11_(&local_a8,(Value *)&local_f0);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      Value::~Value((Value *)&local_f0);
    }
    else {
      if (TVar3 != tokenString) goto LAB_0012b092;
      bVar4 = decodeString(this,&local_88,&local_c8);
      if (!bVar4) {
        recoverFromError(this,tokenObjectEnd);
        goto LAB_0012b221;
      }
    }
    if (0x3fffffff < local_c8._M_string_length) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"keylength >= 2^30","");
      throwRuntimeError((String *)&local_f0);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar5 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar4 = Value::isMember(ppVVar5[-1],&local_c8);
      if (bVar4) {
        std::operator+(&local_a8,"Duplicate key: \'",&local_c8);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_f0.string_ = (char *)&local_e0;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_e0._8_8_ = plVar6[3];
        }
        else {
          local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_f0.string_ = ((char *)*plVar6).string_;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                          local_a8.field_2._M_allocated_capacity + 1);
        }
        addError(this,(String *)&local_f0,&local_88,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        goto LAB_0012b20a;
      }
    }
    bVar4 = readToken(this,(Token *)&local_a8);
    if (!bVar4 || (int)local_a8._M_dataplus._M_p != 0xe) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \':\' after object member name","");
      addError(this,(String *)&local_f0,(Token *)&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0012b20a;
    }
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0.map_ = (ObjectValues *)Value::operator[](ppVVar5[-1],&local_c8);
    pVVar2 = (ValueHolder *)
             (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pVVar2 == (ValueHolder *)
                  ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0.map_);
    }
    else {
      pVVar2->map_ = (ObjectValues *)local_f0;
      piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    bVar4 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar4) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0012b221;
    }
    bVar4 = readTokenSkippingComments(this,&local_70);
    if (!bVar4) goto LAB_0012b01b;
  } while (local_70.type_ == tokenArraySeparator);
  if (local_70.type_ == tokenObjectEnd) {
    bVar4 = true;
  }
  else {
LAB_0012b01b:
    local_f0.string_ = (char *)&local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
    addError(this,(String *)&local_f0,&local_70,(Location)0x0);
    recoverFromError(this,tokenObjectEnd);
LAB_0012b20a:
    if (local_f0 != &local_e0) {
      operator_delete(local_f0.string_,local_e0._M_allocated_capacity + 1);
    }
LAB_0012b221:
    bVar4 = false;
  }
LAB_0012b223:
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readTokenSkippingComments(tokenName)) {
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readTokenSkippingComments(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}